

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O3

bool __thiscall
cmIfCommand::InvokeInitialPass
          (cmIfCommand *this,vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
          cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  bool bVar2;
  long *plVar3;
  cmFunctionBlocker *fb;
  size_type *psVar4;
  MessageType status;
  string err;
  string errorString;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  cmConditionEvaluator conditionEvaluator;
  MessageType local_17c;
  string local_178;
  string local_158;
  cmListFileBacktrace local_138;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> local_128;
  string local_108;
  cmListFileContext local_e8;
  cmConditionEvaluator local_a0;
  
  local_158._M_string_length = 0;
  local_158.field_2._M_local_buf[0] = '\0';
  local_128.
  super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.
  super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  cmMakefile::ExpandArguments((this->super_cmCommand).Makefile,args,&local_128,(char *)0x0);
  pcVar1 = (this->super_cmCommand).Makefile;
  cmMakefile::GetExecutionContext(&local_e8,pcVar1);
  cmMakefile::GetBacktrace((this->super_cmCommand).Makefile);
  cmConditionEvaluator::cmConditionEvaluator(&local_a0,pcVar1,&local_e8,&local_138);
  if (local_138.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_138.TopEntry.
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.FilePath._M_dataplus._M_p != &local_e8.FilePath.field_2) {
    operator_delete(local_e8.FilePath._M_dataplus._M_p,
                    local_e8.FilePath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.Name._M_dataplus._M_p != &local_e8.Name.field_2) {
    operator_delete(local_e8.Name._M_dataplus._M_p,local_e8.Name.field_2._M_allocated_capacity + 1);
  }
  bVar2 = cmConditionEvaluator::IsTrue(&local_a0,&local_128,&local_158,&local_17c);
  if (local_158._M_string_length != 0) {
    cmIfCommandError_abi_cxx11_(&local_108,&local_128);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,0x4e6549);
    psVar4 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_178.field_2._M_allocated_capacity = *psVar4;
      local_178.field_2._8_8_ = plVar3[3];
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    }
    else {
      local_178.field_2._M_allocated_capacity = *psVar4;
      local_178._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_178._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_158._M_dataplus._M_p);
    pcVar1 = (this->super_cmCommand).Makefile;
    if (local_17c == FATAL_ERROR) {
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_178);
      cmSystemTools::s_FatalErrorOccured = true;
    }
    else {
      cmMakefile::IssueMessage(pcVar1,local_17c,&local_178);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
    if (local_17c == FATAL_ERROR) goto LAB_001daa51;
  }
  fb = (cmFunctionBlocker *)operator_new(0x88);
  (fb->StartingContext).Name._M_string_length = 0;
  (fb->StartingContext).Name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(fb->StartingContext).Name.field_2 + 8) = 0;
  (fb->StartingContext).FilePath._M_dataplus._M_p = (pointer)0x0;
  (fb->StartingContext).FilePath._M_string_length = 0;
  (fb->StartingContext).FilePath.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(fb->StartingContext).FilePath.field_2 + 8) = 0;
  (fb->StartingContext).Line = 0;
  fb[1].StartingContext.FilePath._M_string_length = 0;
  (fb->StartingContext).Name._M_dataplus._M_p = (pointer)&(fb->StartingContext).Name.field_2;
  (fb->StartingContext).Name.field_2._M_local_buf[0] = '\0';
  (fb->StartingContext).FilePath._M_dataplus._M_p = (pointer)&(fb->StartingContext).FilePath.field_2
  ;
  (fb->StartingContext).FilePath.field_2._M_local_buf[0] = '\0';
  fb->_vptr_cmFunctionBlocker = (_func_int **)&PTR_IsFunctionBlocked_00620db0;
  *(undefined1 *)((long)&fb[1].StartingContext.FilePath._M_string_length + 2) = 0;
  fb[1]._vptr_cmFunctionBlocker = (_func_int **)0x0;
  fb[1].StartingContext.Name._M_dataplus._M_p = (pointer)0x0;
  fb[1].StartingContext.Name._M_string_length = 0;
  fb[1].StartingContext.Name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&fb[1].StartingContext.Name.field_2 + 8) = 0;
  fb[1].StartingContext.FilePath._M_dataplus._M_p = (pointer)0x0;
  *(undefined4 *)((long)&fb[1].StartingContext.FilePath._M_string_length + 4) = 1;
  *(bool *)&fb[1].StartingContext.FilePath._M_string_length = !bVar2;
  if (bVar2) {
    *(undefined1 *)((long)&fb[1].StartingContext.FilePath._M_string_length + 1) = 1;
  }
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::operator=
            ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)(fb + 1),args);
  cmMakefile::AddFunctionBlocker((this->super_cmCommand).Makefile,fb);
LAB_001daa51:
  if (local_a0.Backtrace.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.Backtrace.TopEntry.
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.ExecutionContext.FilePath._M_dataplus._M_p !=
      &local_a0.ExecutionContext.FilePath.field_2) {
    operator_delete(local_a0.ExecutionContext.FilePath._M_dataplus._M_p,
                    local_a0.ExecutionContext.FilePath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.ExecutionContext.Name._M_dataplus._M_p != &local_a0.ExecutionContext.Name.field_2)
  {
    operator_delete(local_a0.ExecutionContext.Name._M_dataplus._M_p,
                    local_a0.ExecutionContext.Name.field_2._M_allocated_capacity + 1);
  }
  std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::~vector
            (&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,
                    CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                             local_158.field_2._M_local_buf[0]) + 1);
  }
  return true;
}

Assistant:

bool cmIfCommand::InvokeInitialPass(
  const std::vector<cmListFileArgument>& args, cmExecutionStatus&)
{
  std::string errorString;

  std::vector<cmExpandedCommandArgument> expandedArguments;
  this->Makefile->ExpandArguments(args, expandedArguments);

  MessageType status;

  cmConditionEvaluator conditionEvaluator(
    *(this->Makefile), this->Makefile->GetExecutionContext(),
    this->Makefile->GetBacktrace());

  bool isTrue =
    conditionEvaluator.IsTrue(expandedArguments, errorString, status);

  if (!errorString.empty()) {
    std::string err = "if " + cmIfCommandError(expandedArguments);
    err += errorString;
    if (status == MessageType::FATAL_ERROR) {
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, err);
      cmSystemTools::SetFatalErrorOccured();
      return true;
    }
    this->Makefile->IssueMessage(status, err);
  }

  cmIfFunctionBlocker* f = new cmIfFunctionBlocker();
  // if is isn't true block the commands
  f->ScopeDepth = 1;
  f->IsBlocking = !isTrue;
  if (isTrue) {
    f->HasRun = true;
  }
  f->Args = args;
  this->Makefile->AddFunctionBlocker(f);

  return true;
}